

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool __thiscall Matrix::IsUpperTriangular(Matrix *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  Fraction local_38;
  
  iVar5 = this->m_;
  if (0 < iVar5) {
    iVar4 = this->n_;
    lVar9 = 0x18;
    iVar8 = 1;
    lVar6 = 0;
    do {
      lVar1 = lVar6 + 1;
      lVar10 = lVar9;
      iVar7 = iVar8;
      if (lVar1 < iVar4) {
        do {
          lVar2 = *(long *)((long)&(((this->elements_).
                                     super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                                   super__Vector_impl_data + lVar10);
          Fraction::Fraction(&local_38,0);
          bVar3 = operator!=((Fraction *)(lVar6 * 8 + lVar2),&local_38);
          if (bVar3) {
            return false;
          }
          iVar4 = this->n_;
          lVar10 = lVar10 + 0x18;
          iVar7 = iVar7 + 1;
        } while (iVar7 < iVar4);
        iVar5 = this->m_;
      }
      lVar9 = lVar9 + 0x18;
      iVar8 = iVar8 + 1;
      lVar6 = lVar1;
    } while (lVar1 < iVar5);
  }
  return true;
}

Assistant:

bool Matrix::IsUpperTriangular() const {
  for (int column = 0; column < m_; ++column) {
    for (int row = column + 1; row < n_; ++row) {
      if (elements_[row][column] != 0) {
        return false;
      }
    }
  }

  return true;
}